

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Aig_Man_t * Aig_ManDupPartAll(Aig_Man_t *pOld,Vec_Int_t *vPart)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *pNew;
  long lVar4;
  
  Aig_ManIncrementTravId(pOld);
  pNew = Aig_ManStart(5000);
  pAVar2 = pOld->pConst1;
  pAVar3 = pNew->pConst1;
  (pAVar2->field_5).pData = pAVar3;
  (pAVar3->field_5).pData = pAVar2;
  pAVar2->TravId = pOld->nTravIds;
  if (0 < vPart->nSize) {
    lVar4 = 0;
    do {
      iVar1 = vPart->pArray[lVar4];
      if (((long)iVar1 < 0) || (pOld->vCos->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Aig_ManDupPartAll_rec(pNew,pOld,(Aig_Obj_t *)pOld->vCos->pArray[iVar1]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vPart->nSize);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManDupPartAll( Aig_Man_t * pOld, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, Entry;
    Aig_ManIncrementTravId( pOld );
    pNew = Aig_ManStart( 5000 );
    // map constant nodes
    pObj = Aig_ManConst1(pOld);
    pObjNew = Aig_ManConst1(pNew);
    pObj->pData = pObjNew;
    pObjNew->pData = pObj;
    Aig_ObjSetTravIdCurrent(pOld, pObj);
    // map all other nodes
    Vec_IntForEachEntry( vPart, Entry, i )
    {
        pObj = Aig_ManCo( pOld, Entry );
        Aig_ManDupPartAll_rec( pNew, pOld, pObj );
    }
    return pNew;
}